

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  string *psVar1;
  bool bVar2;
  char *pcVar3;
  curl_proxytype cVar4;
  allocator local_31;
  string type;
  
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY");
  if (pcVar3 == (char *)0x0) {
    return;
  }
  cmsys::SystemTools::GetEnv("HTTP_PROXY");
  psVar1 = &this->HTTPProxy;
  std::__cxx11::string::assign((char *)psVar1);
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::append((char *)psVar1);
    cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
    std::__cxx11::string::append((char *)psVar1);
  }
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
  if (pcVar3 == (char *)0x0) goto LAB_002ffba0;
  this->HTTPProxyType = CURLPROXY_HTTP;
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
  std::__cxx11::string::string((string *)&type,pcVar3,&local_31);
  bVar2 = std::operator==(&type,"HTTP");
  cVar4 = CURLPROXY_HTTP;
  if (bVar2) {
LAB_002ffb93:
    this->HTTPProxyType = cVar4;
  }
  else {
    bVar2 = std::operator==(&type,"SOCKS4");
    if (bVar2) {
      cVar4 = CURLPROXY_SOCKS4;
      goto LAB_002ffb93;
    }
    bVar2 = std::operator==(&type,"SOCKS5");
    if (bVar2) {
      cVar4 = CURLPROXY_SOCKS5;
      goto LAB_002ffb93;
    }
  }
  std::__cxx11::string::~string((string *)&type);
LAB_002ffba0:
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
  if (pcVar3 != (char *)0x0) {
    cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
    std::__cxx11::string::assign((char *)&this->HTTPProxyAuth);
  }
  pcVar3 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
    cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
    std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
  }
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  if ( cmSystemTools::GetEnv("HTTP_PROXY") )
    {
    this->HTTPProxy = cmSystemTools::GetEnv("HTTP_PROXY");
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PORT") )
      {
      this->HTTPProxy += ":";
      this->HTTPProxy += cmSystemTools::GetEnv("HTTP_PROXY_PORT");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_TYPE") )
      {
      // this is the default
      this->HTTPProxyType = CURLPROXY_HTTP;
      std::string type = cmSystemTools::GetEnv("HTTP_PROXY_TYPE");
      // HTTP/SOCKS4/SOCKS5
      if ( type == "HTTP" )
        {
        this->HTTPProxyType = CURLPROXY_HTTP;
        }
      else if ( type == "SOCKS4" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
        }
      else if ( type == "SOCKS5" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
        }
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_USER") )
      {
      this->HTTPProxyAuth = cmSystemTools::GetEnv("HTTP_PROXY_USER");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PASSWD") )
      {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += cmSystemTools::GetEnv("HTTP_PROXY_PASSWD");
      }
    }
}